

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udata.cpp
# Opt level: O2

void udata_setCommonData_63(void *data,UErrorCode *pErrorCode)

{
  UDataMemory dataMemory;
  
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (data == (void *)0x0) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      UDataMemory_init_63(&dataMemory);
      UDataMemory_setData_63(&dataMemory,data);
      udata_checkCommonData_63(&dataMemory,pErrorCode);
      if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        setCommonICUData(&dataMemory,'\x01',pErrorCode);
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
udata_setCommonData(const void *data, UErrorCode *pErrorCode) {
    UDataMemory dataMemory;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return;
    }

    if(data==NULL) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    /* set the data pointer and test for validity */
    UDataMemory_init(&dataMemory);
    UDataMemory_setData(&dataMemory, data);
    udata_checkCommonData(&dataMemory, pErrorCode);
    if (U_FAILURE(*pErrorCode)) {return;}

    /* we have good data */
    /* Set it up as the ICU Common Data.  */
    setCommonICUData(&dataMemory, TRUE, pErrorCode);
}